

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool print_value(cJSON *item,printbuffer *output_buffer)

{
  char cVar1;
  size_t sVar2;
  uchar *puVar3;
  size_t raw_length;
  uchar *output;
  printbuffer *output_buffer_local;
  cJSON *item_local;
  
  if ((item == (cJSON *)0x0) || (output_buffer == (printbuffer *)0x0)) {
    item_local._4_4_ = 0;
  }
  else {
    cVar1 = (char)item->type;
    if (cVar1 == '\x01') {
      puVar3 = ensure(output_buffer,6);
      if (puVar3 == (uchar *)0x0) {
        item_local._4_4_ = 0;
      }
      else {
        strcpy((char *)puVar3,"false");
        item_local._4_4_ = 1;
      }
    }
    else if (cVar1 == '\x02') {
      puVar3 = ensure(output_buffer,5);
      if (puVar3 == (uchar *)0x0) {
        item_local._4_4_ = 0;
      }
      else {
        strcpy((char *)puVar3,"true");
        item_local._4_4_ = 1;
      }
    }
    else if (cVar1 == '\x04') {
      puVar3 = ensure(output_buffer,5);
      if (puVar3 == (uchar *)0x0) {
        item_local._4_4_ = 0;
      }
      else {
        strcpy((char *)puVar3,"null");
        item_local._4_4_ = 1;
      }
    }
    else if (cVar1 == '\b') {
      item_local._4_4_ = print_number(item,output_buffer);
    }
    else if (cVar1 == '\x10') {
      item_local._4_4_ = print_string(item,output_buffer);
    }
    else if (cVar1 == ' ') {
      item_local._4_4_ = print_array(item,output_buffer);
    }
    else if (cVar1 == '@') {
      item_local._4_4_ = print_object(item,output_buffer);
    }
    else if (cVar1 == -0x80) {
      if (item->valuestring == (char *)0x0) {
        item_local._4_4_ = 0;
      }
      else {
        sVar2 = strlen(item->valuestring);
        puVar3 = ensure(output_buffer,sVar2 + 1);
        if (puVar3 == (uchar *)0x0) {
          item_local._4_4_ = 0;
        }
        else {
          memcpy(puVar3,item->valuestring,sVar2 + 1);
          item_local._4_4_ = 1;
        }
      }
    }
    else {
      item_local._4_4_ = 0;
    }
  }
  return item_local._4_4_;
}

Assistant:

static cJSON_bool print_value(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output = NULL;

    if ((item == NULL) || (output_buffer == NULL))
    {
        return false;
    }

    switch ((item->type) & 0xFF)
    {
        case cJSON_NULL:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "null");
            return true;

        case cJSON_False:
            output = ensure(output_buffer, 6);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "false");
            return true;

        case cJSON_True:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "true");
            return true;

        case cJSON_Number:
            return print_number(item, output_buffer);

        case cJSON_Raw:
        {
            size_t raw_length = 0;
            if (item->valuestring == NULL)
            {
                return false;
            }

            raw_length = strlen(item->valuestring) + sizeof("");
            output = ensure(output_buffer, raw_length);
            if (output == NULL)
            {
                return false;
            }
            memcpy(output, item->valuestring, raw_length);
            return true;
        }

        case cJSON_String:
            return print_string(item, output_buffer);

        case cJSON_Array:
            return print_array(item, output_buffer);

        case cJSON_Object:
            return print_object(item, output_buffer);

        default:
            return false;
    }
}